

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

int __thiscall
cmMakefile::ConfigureFile
          (cmMakefile *this,string *infile,string *outfile,bool copyonly,bool atOnly,
          bool escapeQuotes,mode_t permissions,cmNewLineStyle newLine)

{
  string *psVar1;
  bool bVar2;
  byte bVar3;
  BOM BVar4;
  char *pcVar5;
  ostream *poVar6;
  string local_858;
  Status local_838;
  string local_830;
  CopyStatus local_810;
  CopyStatus local_800;
  undefined1 local_7f0 [8];
  string outLine;
  string inLine;
  undefined8 local_7a8;
  string local_7a0;
  undefined1 local_780 [8];
  ostringstream e;
  undefined1 local_600 [4];
  BOM bom;
  undefined1 local_5e0 [8];
  ifstream fin;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  undefined1 local_3b8 [8];
  ofstream fout;
  string tempOutputFile;
  _Ios_Openmode local_174;
  string local_170 [4];
  openmode omode;
  string newLineCharacters;
  Status local_12c;
  int local_124;
  string local_120;
  CopyStatus local_100;
  CopyStatus local_f0;
  Status local_e0;
  undefined1 local_d8 [8];
  string path;
  size_type pos;
  string *sinfile;
  string soutfile;
  string local_50;
  int local_30;
  byte local_2b;
  byte local_2a;
  byte local_29;
  int res;
  bool escapeQuotes_local;
  bool atOnly_local;
  bool copyonly_local;
  string *outfile_local;
  string *infile_local;
  cmMakefile *this_local;
  cmNewLineStyle newLine_local;
  
  this_local._0_4_ = newLine.NewLineStyle;
  local_30 = 1;
  local_2b = escapeQuotes;
  local_2a = atOnly;
  local_29 = copyonly;
  _res = outfile;
  outfile_local = infile;
  infile_local = (string *)this;
  bVar2 = CanIWriteThisFile(this,outfile);
  if (!bVar2) {
    cmStrCat<char_const(&)[24],std::__cxx11::string_const&,char_const(&)[26]>
              (&local_50,(char (*) [24])"Attempt to write file: ",_res,
               (char (*) [26])" into a source directory.");
    cmSystemTools::Error(&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    return 0;
  }
  bVar2 = cmsys::SystemTools::FileExists(outfile_local);
  if (!bVar2) {
    psVar1 = (string *)((long)&soutfile.field_2 + 8);
    cmStrCat<char_const(&)[6],std::__cxx11::string_const&,char_const(&)[17]>
              (psVar1,(char (*) [6])0x1105e92,outfile_local,(char (*) [17])0x1138b76);
    cmSystemTools::Error(psVar1);
    std::__cxx11::string::~string((string *)(soutfile.field_2._M_local_buf + 8));
    return 0;
  }
  std::__cxx11::string::string((string *)&sinfile,(string *)_res);
  psVar1 = outfile_local;
  AddCMakeDependFile(this,outfile_local);
  cmsys::SystemTools::ConvertToUnixSlashes((string *)&sinfile);
  AddCMakeOutputFile(this,(string *)&sinfile);
  if (permissions == 0) {
    cmsys::SystemTools::GetPermissions(psVar1,&permissions);
  }
  path.field_2._8_8_ = std::__cxx11::string::rfind((char)&sinfile,0x2f);
  if (path.field_2._8_8_ != -1) {
    std::__cxx11::string::substr((ulong)local_d8,(ulong)&sinfile);
    local_e0 = cmsys::SystemTools::MakeDirectory((string *)local_d8,(mode_t *)0x0);
    std::__cxx11::string::~string((string *)local_d8);
  }
  if ((local_29 & 1) == 0) {
    std::__cxx11::string::string(local_170);
    local_174 = std::operator|(_S_out,_S_trunc);
    bVar2 = cmNewLineStyle::IsValid((cmNewLineStyle *)&this_local);
    if (bVar2) {
      cmNewLineStyle::GetCharacters_abi_cxx11_
                ((string *)((long)&tempOutputFile.field_2 + 8),(cmNewLineStyle *)&this_local);
      std::__cxx11::string::operator=(local_170,(string *)(tempOutputFile.field_2._M_local_buf + 8))
      ;
      std::__cxx11::string::~string((string *)(tempOutputFile.field_2._M_local_buf + 8));
      std::operator|=(&local_174,_S_bin);
    }
    else {
      std::__cxx11::string::operator=(local_170,"\n");
    }
    cmStrCat<std::__cxx11::string&,char_const(&)[5]>
              ((string *)&fout.field_0x1f8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sinfile,
               (char (*) [5])0x117de2c);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    std::ofstream::ofstream(local_3b8,pcVar5,local_174);
    bVar3 = std::ios::operator!((ios *)(local_3b8 + (long)*(_func_int **)((long)local_3b8 + -0x18)))
    ;
    if ((bVar3 & 1) == 0) {
      pcVar5 = (char *)std::__cxx11::string::c_str();
      std::ifstream::ifstream(local_5e0,pcVar5,_S_in);
      bVar3 = std::ios::operator!((ios *)(local_5e0 + (long)*(_func_int **)((long)local_5e0 + -0x18)
                                         ));
      if ((bVar3 & 1) == 0) {
        BVar4 = cmsys::FStream::ReadBOM((istream *)local_5e0);
        if ((BVar4 == BOM_None) || (BVar4 == BOM_UTF8)) {
          std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)((long)&inLine.field_2 + 8),0);
          std::istream::seekg(local_5e0,inLine.field_2._8_8_,local_7a8);
          std::__cxx11::string::string((string *)(outLine.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)local_7f0);
          while (bVar2 = cmsys::SystemTools::GetLineFromStream
                                   ((istream *)local_5e0,(string *)((long)&outLine.field_2 + 8),
                                    (bool *)0x0,0xffffffffffffffff), bVar2) {
            std::__cxx11::string::clear();
            ConfigureString(this,(string *)((long)&outLine.field_2 + 8),(string *)local_7f0,
                            (bool)(local_2a & 1),(bool)(local_2b & 1));
            poVar6 = std::operator<<((ostream *)local_3b8,(string *)local_7f0);
            std::operator<<(poVar6,local_170);
          }
          std::ifstream::close();
          std::ofstream::close();
          local_810 = cmsys::SystemTools::CopyFileIfDifferent
                                ((string *)&fout.field_0x1f8,(string *)&sinfile);
          local_800 = local_810;
          bVar2 = cmsys::Status::operator_cast_to_bool(&local_800.super_Status);
          if (((bVar2 ^ 0xffU) & 1) == 0) {
            local_838 = cmsys::SystemTools::SetPermissions((string *)&sinfile,permissions,false);
            bVar2 = cmsys::Status::operator_cast_to_bool(&local_838);
            if (((bVar2 ^ 0xffU) & 1) != 0) {
              cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
              IssueMessage(this,FATAL_ERROR,&local_858);
              std::__cxx11::string::~string((string *)&local_858);
              local_30 = 0;
            }
          }
          else {
            cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
            IssueMessage(this,FATAL_ERROR,&local_830);
            std::__cxx11::string::~string((string *)&local_830);
            local_30 = 0;
          }
          cmsys::SystemTools::RemoveFile((string *)&fout.field_0x1f8);
          std::__cxx11::string::~string((string *)local_7f0);
          std::__cxx11::string::~string((string *)(outLine.field_2._M_local_buf + 8));
          local_124 = 0;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_780);
          poVar6 = std::operator<<((ostream *)local_780,
                                   "File starts with a Byte-Order-Mark that is not UTF-8:\n  ");
          std::operator<<(poVar6,(string *)psVar1);
          std::__cxx11::ostringstream::str();
          IssueMessage(this,FATAL_ERROR,&local_7a0);
          std::__cxx11::string::~string((string *)&local_7a0);
          this_local._4_4_ = 0;
          local_124 = 1;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_780);
        }
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_600,"Could not open file for read in copy operation ",psVar1);
        cmSystemTools::Error((string *)local_600);
        std::__cxx11::string::~string((string *)local_600);
        this_local._4_4_ = 0;
        local_124 = 1;
      }
      std::ifstream::~ifstream(local_5e0);
    }
    else {
      std::operator+(&local_3d8,"Could not open file for write in copy operation ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &fout.field_0x1f8);
      cmSystemTools::Error(&local_3d8);
      std::__cxx11::string::~string((string *)&local_3d8);
      cmSystemTools::ReportLastSystemError("");
      this_local._4_4_ = 0;
      local_124 = 1;
    }
    std::ofstream::~ofstream(local_3b8);
    std::__cxx11::string::~string((string *)&fout.field_0x1f8);
    std::__cxx11::string::~string(local_170);
    if (local_124 != 0) goto LAB_004bb160;
  }
  else {
    local_100 = cmsys::SystemTools::CopyFileIfDifferent(psVar1,(string *)&sinfile);
    local_f0 = local_100;
    bVar2 = cmsys::Status::operator_cast_to_bool(&local_f0.super_Status);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      IssueMessage(this,FATAL_ERROR,&local_120);
      std::__cxx11::string::~string((string *)&local_120);
      this_local._4_4_ = 0;
      local_124 = 1;
      goto LAB_004bb160;
    }
    local_12c = cmsys::SystemTools::SetPermissions((string *)&sinfile,permissions,false);
    bVar2 = cmsys::Status::operator_cast_to_bool(&local_12c);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      IssueMessage(this,FATAL_ERROR,(string *)((long)&newLineCharacters.field_2 + 8));
      std::__cxx11::string::~string((string *)(newLineCharacters.field_2._M_local_buf + 8));
      this_local._4_4_ = 0;
      local_124 = 1;
      goto LAB_004bb160;
    }
  }
  this_local._4_4_ = local_30;
  local_124 = 1;
LAB_004bb160:
  std::__cxx11::string::~string((string *)&sinfile);
  return this_local._4_4_;
}

Assistant:

int cmMakefile::ConfigureFile(const std::string& infile,
                              const std::string& outfile, bool copyonly,
                              bool atOnly, bool escapeQuotes,
                              mode_t permissions, cmNewLineStyle newLine)
{
  int res = 1;
  if (!this->CanIWriteThisFile(outfile)) {
    cmSystemTools::Error(cmStrCat("Attempt to write file: ", outfile,
                                  " into a source directory."));
    return 0;
  }
  if (!cmSystemTools::FileExists(infile)) {
    cmSystemTools::Error(cmStrCat("File ", infile, " does not exist."));
    return 0;
  }
  std::string soutfile = outfile;
  const std::string& sinfile = infile;
  this->AddCMakeDependFile(sinfile);
  cmSystemTools::ConvertToUnixSlashes(soutfile);

  // Re-generate if non-temporary outputs are missing.
  // when we finalize the configuration we will remove all
  // output files that now don't exist.
  this->AddCMakeOutputFile(soutfile);

  if (permissions == 0) {
    cmSystemTools::GetPermissions(sinfile, permissions);
  }

  std::string::size_type pos = soutfile.rfind('/');
  if (pos != std::string::npos) {
    std::string path = soutfile.substr(0, pos);
    cmSystemTools::MakeDirectory(path);
  }

  if (copyonly) {
    if (!cmSystemTools::CopyFileIfDifferent(sinfile, soutfile)) {
      this->IssueMessage(MessageType::FATAL_ERROR,
                         cmSystemTools::GetLastSystemError());
      return 0;
    }
    if (!cmSystemTools::SetPermissions(soutfile, permissions)) {
      this->IssueMessage(MessageType::FATAL_ERROR,
                         cmSystemTools::GetLastSystemError());
      return 0;
    }
  } else {
    std::string newLineCharacters;
    std::ios::openmode omode = std::ios::out | std::ios::trunc;
    if (newLine.IsValid()) {
      newLineCharacters = newLine.GetCharacters();
      omode |= std::ios::binary;
    } else {
      newLineCharacters = "\n";
    }
    std::string tempOutputFile = cmStrCat(soutfile, ".tmp");
    cmsys::ofstream fout(tempOutputFile.c_str(), omode);
    if (!fout) {
      cmSystemTools::Error("Could not open file for write in copy operation " +
                           tempOutputFile);
      cmSystemTools::ReportLastSystemError("");
      return 0;
    }
    cmsys::ifstream fin(sinfile.c_str());
    if (!fin) {
      cmSystemTools::Error("Could not open file for read in copy operation " +
                           sinfile);
      return 0;
    }

    cmsys::FStream::BOM bom = cmsys::FStream::ReadBOM(fin);
    if (bom != cmsys::FStream::BOM_None && bom != cmsys::FStream::BOM_UTF8) {
      std::ostringstream e;
      e << "File starts with a Byte-Order-Mark that is not UTF-8:\n  "
        << sinfile;
      this->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return 0;
    }
    // rewind to copy BOM to output file
    fin.seekg(0);

    // now copy input to output and expand variables in the
    // input file at the same time
    std::string inLine;
    std::string outLine;
    while (cmSystemTools::GetLineFromStream(fin, inLine)) {
      outLine.clear();
      this->ConfigureString(inLine, outLine, atOnly, escapeQuotes);
      fout << outLine << newLineCharacters;
    }
    // close the files before attempting to copy
    fin.close();
    fout.close();
    if (!cmSystemTools::CopyFileIfDifferent(tempOutputFile, soutfile)) {
      this->IssueMessage(MessageType::FATAL_ERROR,
                         cmSystemTools::GetLastSystemError());
      res = 0;
    } else {
      if (!cmSystemTools::SetPermissions(soutfile, permissions)) {
        this->IssueMessage(MessageType::FATAL_ERROR,
                           cmSystemTools::GetLastSystemError());
        res = 0;
      }
    }
    cmSystemTools::RemoveFile(tempOutputFile);
  }
  return res;
}